

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MasterTable.h
# Opt level: O0

ion_err_t __thiscall
MasterTable::openDictionary<int,int>
          (MasterTable *this,Dictionary<int,_int> *dictionary,ion_dictionary_id_t id)

{
  int iVar1;
  int __oflag;
  MasterTable *__file;
  undefined1 local_48 [8];
  ion_dictionary_config_info_t config;
  ion_err_t err;
  ion_dictionary_id_t id_local;
  Dictionary<int,_int> *dictionary_local;
  MasterTable *this_local;
  
  config._28_4_ = id;
  config.dictionary_type._3_1_ =
       ion_lookup_in_master_table(id,(ion_dictionary_config_info_t *)local_48);
  if (config.dictionary_type._3_1_ == dictionary_type_bpp_tree_t >> 0x18) {
    __file = this;
    config.dictionary_type._3_1_ = ion_switch_handler(config.value_size,&this->handler);
    this_local._7_1_ = config.dictionary_type._3_1_;
    if (config.dictionary_type._3_1_ == dictionary_type_bpp_tree_t >> 0x18) {
      (dictionary->dict).handler = &this->handler;
      iVar1 = Dictionary<int,_int>::open(dictionary,(char *)__file,__oflag);
      this_local._7_1_ = (undefined1)iVar1;
    }
  }
  else {
    this_local._7_1_ = 0x12;
  }
  return this_local._7_1_;
}

Assistant:

ion_err_t
openDictionary(
	Dictionary<K, V>	*dictionary,
	ion_dictionary_id_t id
) {
	ion_err_t						err;
	ion_dictionary_config_info_t	config;

	err = ion_lookup_in_master_table(id, &config);

	/* Lookup for id failed. */
	if (err_ok != err) {
		return err_uninitialized;
	}

	err = ion_switch_handler(config.dictionary_type, &handler);

	if (err_ok != err) {
		return err;
	}

	dictionary->dict.handler	= &handler;

	err							= dictionary->open(config);

	return err;
}